

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

bool __thiscall
booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<char>_>::
valid_offset(boundary_point_index_iterator<std::_List_iterator<char>_> *this,size_t offset)

{
  char *pcVar1;
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  *this_00;
  const_reference pvVar2;
  char *in_RSI;
  char *__s;
  boundary_point_index_iterator<std::_List_iterator<char>_> *in_RDI;
  bool local_11;
  
  local_11 = true;
  if (in_RSI != (char *)0x0) {
    __s = in_RSI;
    pcVar1 = (char *)size((boundary_point_index_iterator<std::_List_iterator<char>_> *)0x14c8fd);
    local_11 = true;
    if (in_RSI + 1 < pcVar1) {
      this_00 = (vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                 *)index(in_RDI,__s,(int)pcVar1);
      pvVar2 = std::
               vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
               ::operator[](this_00,(size_type)in_RSI);
      local_11 = (pvVar2->rule & in_RDI->mask_) != 0;
    }
  }
  return local_11;
}

Assistant:

bool valid_offset(size_t offset) const
                    {
                        return  offset == 0 
                                || offset + 1 >= size() // last and first are always valid regardless of mark
                                || (index()[offset].rule & mask_)!=0;
                    }